

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImGuiWindow *pIVar8;
  ImGuiPopupRef *pIVar9;
  uint *puVar10;
  byte in_SIL;
  undefined8 in_RDI;
  uint uVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  float _x;
  ImRect IVar15;
  ImGuiWindowFlags flags;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *next_window;
  bool moving_within_opened_triangle;
  bool want_close;
  bool want_open;
  bool hovered;
  float extra_w;
  float w_1;
  float w;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool menu_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImRect *in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb1;
  byte in_stack_fffffffffffffeb2;
  byte in_stack_fffffffffffffeb3;
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImGuiMenuColumns *in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar16;
  ImGuiWindow *in_stack_fffffffffffffed0;
  ImGuiCol idx;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  bool local_f9;
  bool local_e9;
  ImVec2 local_e4;
  float local_dc;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImRect local_c0;
  ImGuiWindow *local_b0;
  byte local_a8;
  byte local_a7;
  byte local_a6;
  byte local_a5;
  undefined1 local_a4 [16];
  ImVec2 local_94;
  ImVec2 local_8c;
  float local_84;
  float local_80;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImGuiWindow *pIVar17;
  undefined1 in_stack_ffffffffffffffc0;
  ImGuiContext *size_arg;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  idx = (ImGuiCol)((ulong)in_RDI >> 0x20);
  bVar3 = in_SIL & 1;
  pIVar8 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar8->SkipItems & 1U) == 0) {
    size_arg = GImGui;
    IVar7 = ImGuiWindow::GetID(in_stack_fffffffffffffed0,
                               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                               ,(char *)in_stack_fffffffffffffec0);
    IVar14 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (char *)in_stack_fffffffffffffed0,
                          SUB41((uint)in_stack_fffffffffffffecc >> 0x18,0),in_stack_fffffffffffffec8
                         );
    fVar13 = IVar14.x;
    bVar4 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffeb4);
    local_e9 = false;
    if ((pIVar8->Flags & 0x4000000U) == 0) {
      local_f9 = false;
      if ((size_arg->BeginPopupStack).Size < (size_arg->OpenPopupStack).Size) {
        pIVar9 = ImVector<ImGuiPopupRef>::operator[]
                           (&size_arg->OpenPopupStack,(size_arg->BeginPopupStack).Size);
        IVar1 = pIVar9->OpenParentId;
        puVar10 = ImVector<unsigned_int>::back(&pIVar8->IDStack);
        local_f9 = IVar1 == *puVar10;
      }
      local_e9 = local_f9;
    }
    pIVar17 = size_arg->NavWindow;
    if (local_e9 != false) {
      size_arg->NavWindow = pIVar8;
    }
    ImVec2::ImVec2(&local_50);
    local_58 = (pIVar8->DC).CursorPos;
    if ((pIVar8->DC).LayoutType == 0) {
      _x = (local_58.x + -1.0) - (float)(int)((pIVar2->Style).ItemSpacing.x * 0.5);
      in_stack_fffffffffffffee0 = local_58.y - (pIVar2->Style).FramePadding.y;
      fVar12 = ImGuiWindow::MenuBarHeight
                         ((ImGuiWindow *)
                          CONCAT44(in_stack_fffffffffffffeb4,
                                   CONCAT13(in_stack_fffffffffffffeb3,
                                            CONCAT12(in_stack_fffffffffffffeb2,
                                                     CONCAT11(in_stack_fffffffffffffeb1,
                                                              in_stack_fffffffffffffeb0)))));
      ImVec2::ImVec2(&local_60,_x,in_stack_fffffffffffffee0 + fVar12);
      local_50 = local_60;
      (pIVar8->DC).CursorPos.x =
           (pIVar8->DC).CursorPos.x + (float)(int)((pIVar2->Style).ItemSpacing.x * 0.5);
      local_68 = operator*(&in_stack_fffffffffffffea8->Min,0.0);
      local_6c = fVar13;
      PushStyleVar((ImGuiStyleVar)_x,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      ImVec2::ImVec2(&local_74,local_6c,0.0);
      bVar5 = Selectable((char *)CONCAT17(bVar3,in_stack_ffffffffffffffe8),
                         SUB81((ulong)pIVar8 >> 0x38,0),(ImGuiSelectableFlags)pIVar8,
                         (ImVec2 *)size_arg);
      PopStyleVar((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      (pIVar8->DC).CursorPos.x =
           (float)(int)((pIVar2->Style).ItemSpacing.x * -0.5) + (pIVar8->DC).CursorPos.x;
    }
    else {
      ImVec2::ImVec2(&local_7c,local_58.x,local_58.y - (pIVar2->Style).WindowPadding.y);
      local_50 = local_7c;
      local_80 = ImGuiMenuColumns::DeclColumns
                           (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                            in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      local_8c = GetContentRegionAvail();
      local_84 = ImMax<float>(0.0,local_8c.x - local_80);
      uVar16 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffecc);
      in_stack_fffffffffffffedc = 0;
      if (((bVar3 ^ 0xff) & 1) != 0) {
        in_stack_fffffffffffffedc = 8;
      }
      in_stack_fffffffffffffedc = in_stack_fffffffffffffedc | 0x2c01;
      ImVec2::ImVec2(&local_94,local_80,0.0);
      bVar5 = Selectable((char *)CONCAT17(bVar3,in_stack_ffffffffffffffe8),
                         SUB81((ulong)pIVar8 >> 0x38,0),(ImGuiSelectableFlags)pIVar8,
                         (ImVec2 *)size_arg);
      if ((bVar3 & 1) == 0) {
        PushStyleColor(idx,(ImVec4 *)CONCAT44(uVar16,in_stack_fffffffffffffec8));
      }
      in_stack_fffffffffffffec0 = (ImGuiMenuColumns *)local_a4;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffec0,
                     size_arg->FontSize * 0.3 + (pIVar8->MenuColumns).Pos[2] + local_84,0.0);
      local_a4._8_8_ = operator+(&in_stack_fffffffffffffea8->Min,(ImVec2 *)0x17855f);
      IVar14.x._1_1_ = local_e9;
      IVar14.x._0_1_ = in_stack_ffffffffffffffc0;
      IVar14.x._2_1_ = bVar4;
      IVar14.x._3_1_ = bVar5;
      IVar14.y = fVar13;
      RenderArrow(IVar14,(ImGuiDir)((ulong)pIVar17 >> 0x20),SUB84(pIVar17,0));
      if ((bVar3 & 1) == 0) {
        PopStyleColor((int)in_stack_fffffffffffffeb4);
      }
    }
    local_a5 = false;
    if ((bVar3 & 1) != 0) {
      local_a5 = ItemHoverable((ImRect *)
                               (CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) &
                               0xffffffffffffff),(ImGuiID)in_stack_fffffffffffffeb4);
    }
    if ((local_e9 & 1U) != 0) {
      size_arg->NavWindow = pIVar17;
    }
    local_a6 = 0;
    local_a7 = 0;
    if ((pIVar8->DC).LayoutType == 1) {
      local_a8 = 0;
      if ((((size_arg->HoveredWindow == pIVar8) &&
           ((size_arg->BeginPopupStack).Size < (size_arg->OpenPopupStack).Size)) &&
          (pIVar9 = ImVector<ImGuiPopupRef>::operator[]
                              (&size_arg->OpenPopupStack,(size_arg->BeginPopupStack).Size),
          pIVar9->ParentWindow == pIVar8)) && ((pIVar8->Flags & 0x400U) == 0)) {
        pIVar9 = ImVector<ImGuiPopupRef>::operator[]
                           (&size_arg->OpenPopupStack,(size_arg->BeginPopupStack).Size);
        local_b0 = pIVar9->Window;
        if (local_b0 != (ImGuiWindow *)0x0) {
          IVar15 = ImGuiWindow::Rect((ImGuiWindow *)0x1786fd);
          local_c0.Min = IVar15.Min;
          local_c0.Max = IVar15.Max;
          local_c8 = operator-(&in_stack_fffffffffffffea8->Min,(ImVec2 *)0x17872d);
          if ((local_b0->Pos).x <= (pIVar8->Pos).x) {
            local_d0 = ImRect::GetTR(in_stack_fffffffffffffea8);
          }
          else {
            local_d0 = ImRect::GetTL(&local_c0);
          }
          if ((local_b0->Pos).x <= (pIVar8->Pos).x) {
            local_d8 = ImRect::GetBR(&local_c0);
          }
          else {
            local_d8 = ImRect::GetBL(in_stack_fffffffffffffea8);
          }
          fVar13 = ImFabs(local_c8.x - local_d0.x);
          local_dc = ImClamp<float>(fVar13 * 0.3,5.0,30.0);
          uVar11 = -(uint)((pIVar8->Pos).x < (local_b0->Pos).x);
          local_c8.x = (float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000) + local_c8.x;
          in_stack_fffffffffffffeb4 = local_c8.y;
          fVar13 = ImMax<float>((local_d0.y - local_dc) - local_c8.y,-100.0);
          local_d0.y = in_stack_fffffffffffffeb4 + fVar13;
          fVar13 = local_c8.y;
          fVar12 = ImMin<float>((local_d8.y + local_dc) - local_c8.y,100.0);
          local_d8.y = fVar13 + fVar12;
          local_a8 = ImTriangleContainsPoint(&local_c8,&local_d0,&local_d8,&(size_arg->IO).MousePos)
          ;
        }
      }
      in_stack_fffffffffffffeb3 = 0;
      if ((((bVar4 & 1) != 0) && (in_stack_fffffffffffffeb3 = 0, (local_a5 & 1) == 0)) &&
         ((in_stack_fffffffffffffeb3 = 0, size_arg->HoveredWindow == pIVar8 &&
          ((in_stack_fffffffffffffeb3 = 0, size_arg->HoveredIdPreviousFrame != 0 &&
           (in_stack_fffffffffffffeb3 = 0, size_arg->HoveredIdPreviousFrame != IVar7)))))) {
        in_stack_fffffffffffffeb3 = local_a8 ^ 0xff;
      }
      if (((((bVar4 & 1) != 0) || ((local_a5 & 1) == 0)) ||
          (in_stack_fffffffffffffeb2 = 1, (local_a8 & 1) != 0)) &&
         ((in_stack_fffffffffffffeb1 = 0, in_stack_fffffffffffffeb2 = 0, (bVar4 & 1) == 0 &&
          (in_stack_fffffffffffffeb1 = 0, in_stack_fffffffffffffeb2 = 0, (local_a5 & 1) != 0)))) {
        in_stack_fffffffffffffeb1 = bVar5;
        in_stack_fffffffffffffeb2 = bVar5;
      }
      local_a7 = in_stack_fffffffffffffeb3;
      local_a6 = in_stack_fffffffffffffeb2;
      if (size_arg->NavActivateId == IVar7) {
        local_a6 = bVar4 ^ 0xff;
        local_a7 = bVar4;
      }
      local_a6 = local_a6 & 1;
      local_a7 = local_a7 & 1;
      if (((size_arg->NavId == IVar7) && ((size_arg->NavMoveRequest & 1U) != 0)) &&
         (size_arg->NavMoveDir == 1)) {
        local_a6 = 1;
        NavMoveRequestCancel();
      }
    }
    else if ((((bVar4 & 1) == 0) || ((bVar5 & 1) == 0)) || ((local_e9 & 1U) == 0)) {
      if (((bVar5 & 1) == 0) &&
         ((((bool)local_a5 == false || ((local_e9 & 1U) == 0)) || ((bVar4 & 1) != 0)))) {
        if (((size_arg->NavId == IVar7) && ((size_arg->NavMoveRequest & 1U) != 0)) &&
           (size_arg->NavMoveDir == 3)) {
          local_a6 = 1;
          NavMoveRequestCancel();
        }
      }
      else {
        local_a6 = 1;
      }
    }
    else {
      local_a7 = 1;
      bVar4 = 0;
      local_a6 = 0;
    }
    if ((bVar3 & 1) == 0) {
      local_a7 = 1;
    }
    if (((local_a7 & 1) != 0) && (bVar6 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffeb4), bVar6)) {
      ClosePopupToLevel((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffec0 >> 0x18,0));
    }
    if ((((bVar4 & 1) == 0) && ((local_a6 & 1) != 0)) &&
       ((size_arg->BeginPopupStack).Size < (size_arg->OpenPopupStack).Size)) {
      OpenPopup((char *)CONCAT44(in_stack_fffffffffffffeb4,
                                 CONCAT13(in_stack_fffffffffffffeb3,
                                          CONCAT12(in_stack_fffffffffffffeb2,
                                                   CONCAT11(in_stack_fffffffffffffeb1,
                                                            in_stack_fffffffffffffeb0)))));
      local_1 = false;
    }
    else {
      bVar3 = (bVar4 & 1) != 0 || (local_a6 & 1) != 0;
      if ((local_a6 & 1) != 0) {
        OpenPopup((char *)CONCAT44(in_stack_fffffffffffffeb4,
                                   CONCAT13(in_stack_fffffffffffffeb3,
                                            CONCAT12(in_stack_fffffffffffffeb2,
                                                     CONCAT11(in_stack_fffffffffffffeb1,
                                                              in_stack_fffffffffffffeb0)))));
      }
      if ((bVar3 & 1) != 0) {
        ImVec2::ImVec2(&local_e4,0.0,0.0);
        SetNextWindowPos(&local_50,1,&local_e4);
        bVar3 = BeginPopupEx((ImGuiID)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      local_1 = (bool)(bVar3 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu (using FindBestWindowPosForPopup).
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - (float)(int)(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderArrow(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), ImGuiDir_Right);
        if (!enabled) PopStyleColor();
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false, want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].ParentWindow == window && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.BeginPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
        if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
            flags |= ImGuiWindowFlags_ChildWindow;
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}